

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O3

int setup_imm_addr(gen_ctx *gen_ctx,uint64_t v,int *mod,int *rm,int64_t *disp32,int call_p,
                  MIR_item_t func_item)

{
  VARR_uint64_t *pVVar1;
  VARR_const_ref_t *pVVar2;
  uint uVar3;
  uint64_t *__ptr;
  const_ref_t *__ptr_00;
  MIR_item_t __ptr_01;
  ulong uVar4;
  MIR_context_t pMVar5;
  uint extraout_EDX;
  size_t sVar6;
  MIR_context_t pMVar7;
  uint *__size;
  undefined1 *puVar8;
  size_t sVar9;
  
  pVVar1 = gen_ctx->target_ctx->const_pool;
  if (pVVar1 == (VARR_uint64_t *)0x0) {
    setup_imm_addr_cold_4();
  }
  else {
    sVar9 = pVVar1->els_num;
    __ptr = pVVar1->varr;
    if (sVar9 == 0) {
      __size = (uint *)&DAT_00000001;
      if (__ptr == (uint64_t *)0x0) goto LAB_00173c6e;
    }
    else {
      sVar6 = 0;
      do {
        __size = (uint *)v;
        if (__ptr[sVar6] == v) goto LAB_00173b42;
        sVar6 = sVar6 + 1;
      } while (sVar9 != sVar6);
      __size = (uint *)(sVar9 + 1);
    }
    sVar6 = sVar9;
    if ((uint *)pVVar1->size < __size) {
      puVar8 = (undefined1 *)(((ulong)__size >> 1) + (long)__size);
      __ptr = (uint64_t *)realloc(__ptr,(long)puVar8 * 8);
      pVVar1->varr = __ptr;
      pVVar1->size = (size_t)puVar8;
      __size = (uint *)(pVVar1->els_num + 1);
      sVar6 = pVVar1->els_num;
    }
    pVVar1->els_num = (size_t)__size;
    __ptr[sVar6] = v;
    sVar6 = sVar9;
LAB_00173b42:
    if (((-1 < *mod) || (-1 < *rm)) || (-1 < *disp32)) {
      __assert_fail("*mod < 0 && *rm < 0 && *disp32 < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0x886,"void setup_rip_rel_addr(MIR_disp_t, int *, int *, int64_t *)");
    }
    *rm = 5;
    if (*mod < 0) {
      *mod = 0;
      *disp32 = 0;
      pVVar2 = gen_ctx->target_ctx->const_refs;
      __ptr_00 = pVVar2->varr;
      if (__ptr_00 == (const_ref_t *)0x0) {
        setup_imm_addr_cold_2();
      }
      else {
        sVar9 = pVVar2->els_num;
        uVar4 = sVar9 + 1;
        if (pVVar2->size < uVar4) {
          sVar9 = (uVar4 >> 1) + uVar4;
          __size = (uint *)(sVar9 * 0x28);
          __ptr_00 = (const_ref_t *)realloc(__ptr_00,(size_t)__size);
          pVVar2->varr = __ptr_00;
          pVVar2->size = sVar9;
          sVar9 = pVVar2->els_num;
          uVar4 = sVar9 + 1;
        }
        pVVar2->els_num = uVar4;
        __ptr_00[sVar9].call_p = call_p;
        __ptr_00[sVar9].func_item = func_item;
        __ptr_00[sVar9].pc = 0;
        (&__ptr_00[sVar9].pc)[1] = 0;
        __ptr_00[sVar9].const_num = sVar6;
        pVVar2 = gen_ctx->target_ctx->const_refs;
        if (pVVar2 != (VARR_const_ref_t *)0x0) {
          return (int)pVVar2->els_num + -1;
        }
      }
      setup_imm_addr_cold_1();
LAB_00173c6e:
      setup_imm_addr_cold_3();
      __ptr_01 = gen_ctx->curr_func_item;
      if (__ptr_01 != (MIR_item_t)0x0) {
        pMVar7 = gen_ctx->ctx;
        pMVar5 = (MIR_context_t)((long)&pMVar7->gen_ctx + 1);
        if (*(MIR_context_t *)&gen_ctx->optimize_level < pMVar5) {
          puVar8 = (undefined1 *)((long)&pMVar5->gen_ctx + ((ulong)pMVar5 >> 1));
          __ptr_01 = (MIR_item_t)realloc(__ptr_01,(size_t)puVar8);
          gen_ctx->curr_func_item = __ptr_01;
          *(undefined1 **)&gen_ctx->optimize_level = puVar8;
          pMVar7 = gen_ctx->ctx;
          pMVar5 = (MIR_context_t)((long)&pMVar7->gen_ctx + 1);
        }
        gen_ctx->ctx = pMVar5;
        *(char *)((long)&__ptr_01->data + (long)pMVar7) = (char)__size;
        return (int)__ptr_01;
      }
      put_byte_cold_1();
      if (((gen_ctx == (gen_ctx *)0x0) || (*(int *)&gen_ctx->ctx < 0)) &&
         ((extraout_EDX < 0x22 && ((int)*__size < 0)))) {
        uVar3 = extraout_EDX - 0x10;
        if (extraout_EDX < 0x10) {
          uVar3 = extraout_EDX;
        }
        if (7 < uVar3) {
          if (gen_ctx != (gen_ctx *)0x0) {
            *(undefined4 *)&gen_ctx->ctx = 1;
          }
          uVar3 = uVar3 - 8;
        }
        *__size = uVar3;
        return uVar3;
      }
      __assert_fail("(rex == ((void*)0) || *rex < 0) && *r < 0 && v >= 0 && v <= ST1_HARD_REG",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0x85d,"void setup_r(int *, int *, int)");
    }
  }
  __assert_fail("*mod < 0 && v >= 0 && v <= 3",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                ,0x878,"void setup_mod(int *, int)");
}

Assistant:

static int setup_imm_addr (struct gen_ctx *gen_ctx, uint64_t v, int *mod, int *rm, int64_t *disp32,
                           int call_p, MIR_item_t func_item) {
  const_ref_t cr;
  size_t n;

  n = add_to_const_pool (gen_ctx, v);
  setup_rip_rel_addr (0, mod, rm, disp32);
  cr.call_p = call_p;
  cr.func_item = func_item;
  cr.pc = 0;
  cr.next_insn_disp = 0;
  cr.const_num = n;
  VARR_PUSH (const_ref_t, const_refs, cr);
  return (int) VARR_LENGTH (const_ref_t, const_refs) - 1;
}